

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

bool __thiscall VcprojGenerator::isStandardSuffix(VcprojGenerator *this,QString *suffix)

{
  QMakeProject *pQVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ProStringList *pPVar5;
  char *ch;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_60,"QMAKE_APP_FLAG");
  pPVar5 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_60);
  lVar2 = (pPVar5->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_60);
  if (lVar2 == 0) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)local_60,"shared");
    bVar3 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_60,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_60);
    if (bVar3) {
      ch = "dll";
    }
    else {
      ch = "lib";
    }
  }
  else {
    ch = "exe";
  }
  QString::QString((QString *)local_60,ch);
  iVar4 = QString::compare((QString *)suffix,(CaseSensitivity)local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool VcprojGenerator::isStandardSuffix(const QString &suffix) const
{
    if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        if (suffix.compare("exe", Qt::CaseInsensitive) == 0)
            return true;
    } else if (project->isActiveConfig("shared")) {
        if (suffix.compare("dll", Qt::CaseInsensitive) == 0)
            return true;
    } else {
        if (suffix.compare("lib", Qt::CaseInsensitive) == 0)
            return true;
    }
    return false;
}